

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  ImFontConfig *pIVar1;
  ImFont **ppIVar2;
  void *__dest;
  ImFont *pIVar3;
  ImFont *local_20;
  
  if (this->Locked == true) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x734,"AddFont","ImGui ASSERT FAILED: %s",
                "!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
               );
  }
  if ((font_cfg->FontData == (void *)0x0) || (font_cfg->FontDataSize < 1)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x735,"AddFont","ImGui ASSERT FAILED: %s",
                "font_cfg->FontData != NULL && font_cfg->FontDataSize > 0");
  }
  if (font_cfg->SizePixels <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x736,"AddFont","ImGui ASSERT FAILED: %s","font_cfg->SizePixels > 0.0f");
  }
  if (font_cfg->MergeMode == false) {
    local_20 = (ImFont *)ImGui::MemAlloc(0x78);
    (local_20->IndexAdvanceX).Size = 0;
    (local_20->IndexAdvanceX).Capacity = 0;
    (local_20->IndexAdvanceX).Data = (float *)0x0;
    local_20->FallbackAdvanceX = 0.0;
    local_20->FontSize = 0.0;
    (local_20->IndexLookup).Size = 0;
    (local_20->IndexLookup).Capacity = 0;
    (local_20->Glyphs).Data = (ImFontGlyph *)0x0;
    (local_20->IndexLookup).Data = (unsigned_short *)0x0;
    (local_20->Glyphs).Size = 0;
    (local_20->Glyphs).Capacity = 0;
    local_20->EllipsisChar = 0xffff;
    local_20->DirtyLookupTables = false;
    local_20->FallbackGlyph = (ImFontGlyph *)0x0;
    (local_20->DisplayOffset).x = 0.0;
    (local_20->DisplayOffset).y = 0.0;
    local_20->ContainerAtlas = (ImFontAtlas *)0x0;
    local_20->ConfigData = (ImFontConfig *)0x0;
    local_20->ConfigDataCount = 0;
    local_20->FallbackChar = 0x3f;
    local_20->Scale = 1.0;
    local_20->Ascent = 0.0;
    local_20->Descent = 0.0;
    *(undefined8 *)((long)&local_20->Descent + 2) = 0;
    ImVector<ImFont_*>::push_back(&this->Fonts,&local_20);
  }
  else if ((this->Fonts).Size == 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x73c,"AddFont","ImGui ASSERT FAILED: %s",
                "!Fonts.empty() && \"Cannot use MergeMode for the first font\"");
  }
  ImVector<ImFontConfig>::push_back(&this->ConfigData,font_cfg);
  pIVar1 = ImVector<ImFontConfig>::back(&this->ConfigData);
  pIVar3 = pIVar1->DstFont;
  if (pIVar3 == (ImFont *)0x0) {
    ppIVar2 = ImVector<ImFont_*>::back(&this->Fonts);
    pIVar3 = *ppIVar2;
    pIVar1->DstFont = pIVar3;
  }
  if (pIVar1->FontDataOwnedByAtlas == false) {
    __dest = ImGui::MemAlloc((long)pIVar1->FontDataSize);
    pIVar1->FontData = __dest;
    pIVar1->FontDataOwnedByAtlas = true;
    memcpy(__dest,font_cfg->FontData,(long)pIVar1->FontDataSize);
    pIVar3 = pIVar1->DstFont;
  }
  if (pIVar3->EllipsisChar == 0xffff) {
    pIVar3->EllipsisChar = font_cfg->EllipsisChar;
  }
  ClearTexData(this);
  return pIVar1->DstFont;
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    if (new_font_cfg.DstFont->EllipsisChar == (ImWchar)-1)
        new_font_cfg.DstFont->EllipsisChar = font_cfg->EllipsisChar;

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}